

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O3

int RSA_encrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  int iVar1;
  uint tlen;
  int iVar2;
  ulong size;
  BN_CTX *ctx;
  BIGNUM *ret;
  BIGNUM *r;
  uint8_t *to;
  BIGNUM *pBVar3;
  BN_MONT_CTX *pBVar4;
  int line;
  
  if ((rsa->n == (BIGNUM *)0x0) || (rsa->e == (BIGNUM *)0x0)) {
    iVar1 = 0x90;
    iVar2 = 0x157;
LAB_004c74ba:
    ERR_put_error(4,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,iVar2);
    return 0;
  }
  iVar1 = rsa_check_public_key(rsa);
  if (iVar1 == 0) {
    return 0;
  }
  tlen = RSA_size((RSA *)rsa);
  size = (ulong)tlen;
  if (max_out < size) {
    iVar1 = 0x87;
    iVar2 = 0x161;
    goto LAB_004c74ba;
  }
  ctx = BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    return 0;
  }
  BN_CTX_start(ctx);
  ret = BN_CTX_get(ctx);
  r = BN_CTX_get(ctx);
  to = (uint8_t *)OPENSSL_malloc(size);
  iVar1 = 0;
  if (to == (uint8_t *)0x0 || (r == (BIGNUM *)0x0 || ret == (BIGNUM *)0x0)) goto LAB_004c7633;
  if (padding == 4) {
    iVar2 = RSA_padding_add_PKCS1_OAEP_mgf1
                      (to,size,in,in_len,(uint8_t *)0x0,0,(EVP_MD *)0x0,(EVP_MD *)0x0);
LAB_004c75b6:
    if ((0 < iVar2) && (pBVar3 = BN_bin2bn(to,tlen,ret), pBVar3 != (BIGNUM *)0x0)) {
      iVar2 = BN_ucmp(ret,(BIGNUM *)rsa->n);
      if (iVar2 < 0) {
        pBVar4 = BN_MONT_CTX_set_locked
                           ((BN_MONT_CTX **)&rsa->mont_n,(int)rsa + 0x58,(BIGNUM *)rsa->n,ctx);
        if ((int)pBVar4 != 0) {
          iVar2 = BN_mod_exp_mont(r,ret,(BIGNUM *)rsa->e,
                                  (BIGNUM *)&(((BN_MONT_CTX *)rsa->mont_n)->RR).neg,ctx,
                                  (BN_MONT_CTX *)rsa->mont_n);
          if (iVar2 == 0) goto LAB_004c7633;
          iVar1 = BN_bn2bin_padded(out,size,(BIGNUM *)r);
          if (iVar1 != 0) {
            *out_len = size;
            iVar1 = 1;
            goto LAB_004c7633;
          }
          iVar2 = 0x44;
          line = 0x19b;
          goto LAB_004c762b;
        }
      }
      else {
        ERR_put_error(4,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                      ,0x18e);
      }
    }
    iVar1 = 0;
  }
  else {
    if (padding == 3) {
      iVar2 = RSA_padding_add_none(to,tlen,in,(int)in_len);
      goto LAB_004c75b6;
    }
    if (padding == 1) {
      iVar2 = rsa_padding_add_PKCS1_type_2(to,size,in,in_len);
      goto LAB_004c75b6;
    }
    iVar2 = 0x8f;
    line = 0x180;
LAB_004c762b:
    iVar1 = 0;
    ERR_put_error(4,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,line);
  }
LAB_004c7633:
  OPENSSL_free(to);
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  return iVar1;
}

Assistant:

int RSA_encrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->n == NULL || rsa->e == NULL) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_VALUE_MISSING);
    return 0;
  }

  if (!rsa_check_public_key(rsa)) {
    return 0;
  }

  const unsigned rsa_size = RSA_size(rsa);
  if (max_out < rsa_size) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_OUTPUT_BUFFER_TOO_SMALL);
    return 0;
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }

  bssl::BN_CTXScope scope(ctx.get());
  BIGNUM *f = BN_CTX_get(ctx.get());
  BIGNUM *result = BN_CTX_get(ctx.get());
  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(rsa_size));
  int i, ret = 0;
  if (!f || !result || !buf) {
    goto err;
  }

  switch (padding) {
    case RSA_PKCS1_PADDING:
      i = rsa_padding_add_PKCS1_type_2(buf, rsa_size, in, in_len);
      break;
    case RSA_PKCS1_OAEP_PADDING:
      // Use the default parameters: SHA-1 for both hashes and no label.
      i = RSA_padding_add_PKCS1_OAEP_mgf1(buf, rsa_size, in, in_len, nullptr, 0,
                                          nullptr, nullptr);
      break;
    case RSA_NO_PADDING:
      i = RSA_padding_add_none(buf, rsa_size, in, in_len);
      break;
    default:
      OPENSSL_PUT_ERROR(RSA, RSA_R_UNKNOWN_PADDING_TYPE);
      goto err;
  }

  if (i <= 0) {
    goto err;
  }

  if (BN_bin2bn(buf, rsa_size, f) == nullptr) {
    goto err;
  }

  if (BN_ucmp(f, rsa->n) >= 0) {
    // usually the padding functions would catch this
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_MODULUS);
    goto err;
  }

  if (!BN_MONT_CTX_set_locked(&rsa->mont_n, &rsa->lock, rsa->n, ctx.get()) ||
      !BN_mod_exp_mont(result, f, rsa->e, &rsa->mont_n->N, ctx.get(),
                       rsa->mont_n)) {
    goto err;
  }

  // put in leading 0 bytes if the number is less than the length of the
  // modulus
  if (!BN_bn2bin_padded(out, rsa_size, result)) {
    OPENSSL_PUT_ERROR(RSA, ERR_R_INTERNAL_ERROR);
    goto err;
  }

  *out_len = rsa_size;
  ret = 1;

err:
  OPENSSL_free(buf);
  return ret;
}